

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AsmJsByteCodeGenerator.cpp
# Opt level: O0

EmitExpressionInfo __thiscall
Js::AsmJSByteCodeGenerator::EmitBinaryComparator
          (AsmJSByteCodeGenerator *this,ParseNode *pnode,EBinaryComparatorOpCodes op)

{
  EmitExpressionInfo EVar1;
  bool bVar2;
  ParseNode *pnode_00;
  ParseNode *pnode_01;
  AsmJsCompilationException *pAVar3;
  OpCodeAsmJs local_66;
  AsmJsType local_64;
  OpCodeAsmJs compOp;
  AsmJsType *pAStack_60;
  AsmJsType *rType;
  AsmJsType *lType;
  EmitExpressionInfo rhsEmit;
  EmitExpressionInfo *lhsEmit;
  ParseNode *rhs;
  ParseNode *lhs;
  EBinaryComparatorOpCodes op_local;
  ParseNode *pnode_local;
  AsmJSByteCodeGenerator *this_local;
  EmitExpressionInfo emitInfo;
  
  pnode_00 = ParserWrapper::GetBinaryLeft(pnode);
  pnode_01 = ParserWrapper::GetBinaryRight(pnode);
  rhsEmit = Emit(this,pnode_00);
  lType = (AsmJsType *)Emit(this,pnode_01);
  rType = &rhsEmit.type;
  pAStack_60 = (AsmJsType *)((long)&lType + 4);
  StartStatement(this,pnode);
  AsmJsType::AsmJsType(&local_64,Int);
  EmitExpressionInfo::EmitExpressionInfo((EmitExpressionInfo *)&this_local,&local_64);
  bVar2 = AsmJsType::isUnsigned(rType);
  if ((bVar2) && (bVar2 = AsmJsType::isUnsigned(pAStack_60), bVar2)) {
    bVar2 = AsmJsFunc::IsValidLocation<int>(this->mFunction,&rhsEmit);
    if (!bVar2) {
      pAVar3 = (AsmJsCompilationException *)__cxa_allocate_exception(0x200);
      AsmJsCompilationException::AsmJsCompilationException
                (pAVar3,L"Invalid Node location[%d] ",(ulong)rhsEmit & 0xffffffff);
      __cxa_throw(pAVar3,&AsmJsCompilationException::typeinfo,0);
    }
    bVar2 = AsmJsFunc::IsValidLocation<int>(this->mFunction,(EmitExpressionInfo *)&lType);
    if (!bVar2) {
      pAVar3 = (AsmJsCompilationException *)__cxa_allocate_exception(0x200);
      AsmJsCompilationException::AsmJsCompilationException
                (pAVar3,L"Invalid Node location[%d] ",(ulong)lType & 0xffffffff);
      __cxa_throw(pAVar3,&AsmJsCompilationException::typeinfo,0);
    }
    this_local._0_4_ = GetAndReleaseBinaryLocations<int>(this,&rhsEmit,(EmitExpressionInfo *)&lType)
    ;
    local_66 = *(OpCodeAsmJs *)(BinaryComparatorOpCodes + (long)(int)op * 8 + 2);
  }
  else {
    bVar2 = AsmJsType::isSigned(rType);
    if ((bVar2) && (bVar2 = AsmJsType::isSigned(pAStack_60), bVar2)) {
      bVar2 = AsmJsFunc::IsValidLocation<int>(this->mFunction,&rhsEmit);
      if (!bVar2) {
        pAVar3 = (AsmJsCompilationException *)__cxa_allocate_exception(0x200);
        AsmJsCompilationException::AsmJsCompilationException
                  (pAVar3,L"Invalid Node location[%d] ",(ulong)rhsEmit & 0xffffffff);
        __cxa_throw(pAVar3,&AsmJsCompilationException::typeinfo,0);
      }
      bVar2 = AsmJsFunc::IsValidLocation<int>(this->mFunction,(EmitExpressionInfo *)&lType);
      if (!bVar2) {
        pAVar3 = (AsmJsCompilationException *)__cxa_allocate_exception(0x200);
        AsmJsCompilationException::AsmJsCompilationException
                  (pAVar3,L"Invalid Node location[%d] ",(ulong)lType & 0xffffffff);
        __cxa_throw(pAVar3,&AsmJsCompilationException::typeinfo,0);
      }
      this_local._0_4_ =
           GetAndReleaseBinaryLocations<int>(this,&rhsEmit,(EmitExpressionInfo *)&lType);
      local_66 = *(OpCodeAsmJs *)(BinaryComparatorOpCodes + (long)(int)op * 8);
    }
    else {
      bVar2 = AsmJsType::isDouble(rType);
      if ((bVar2) && (bVar2 = AsmJsType::isDouble(pAStack_60), bVar2)) {
        bVar2 = AsmJsFunc::IsValidLocation<double>(this->mFunction,&rhsEmit);
        if (!bVar2) {
          pAVar3 = (AsmJsCompilationException *)__cxa_allocate_exception(0x200);
          AsmJsCompilationException::AsmJsCompilationException
                    (pAVar3,L"Invalid Node location[%d] ",(ulong)rhsEmit & 0xffffffff);
          __cxa_throw(pAVar3,&AsmJsCompilationException::typeinfo,0);
        }
        bVar2 = AsmJsFunc::IsValidLocation<double>(this->mFunction,(EmitExpressionInfo *)&lType);
        if (!bVar2) {
          pAVar3 = (AsmJsCompilationException *)__cxa_allocate_exception(0x200);
          AsmJsCompilationException::AsmJsCompilationException
                    (pAVar3,L"Invalid Node location[%d] ",(ulong)lType & 0xffffffff);
          __cxa_throw(pAVar3,&AsmJsCompilationException::typeinfo,0);
        }
        this_local._0_4_ = AsmJsFunc::AcquireTmpRegister<int>(this->mFunction);
        AsmJsFunc::ReleaseLocation<double>(this->mFunction,(EmitExpressionInfo *)&lType);
        AsmJsFunc::ReleaseLocation<double>(this->mFunction,&rhsEmit);
        local_66 = *(OpCodeAsmJs *)(BinaryComparatorOpCodes + (long)(int)op * 8 + 6);
      }
      else {
        bVar2 = AsmJsType::isFloat(rType);
        if ((!bVar2) || (bVar2 = AsmJsType::isFloat(pAStack_60), !bVar2)) {
          pAVar3 = (AsmJsCompilationException *)__cxa_allocate_exception(0x200);
          AsmJsCompilationException::AsmJsCompilationException
                    (pAVar3,L"Type not supported for comparison");
          __cxa_throw(pAVar3,&AsmJsCompilationException::typeinfo,0);
        }
        bVar2 = AsmJsFunc::IsValidLocation<float>(this->mFunction,&rhsEmit);
        if (!bVar2) {
          pAVar3 = (AsmJsCompilationException *)__cxa_allocate_exception(0x200);
          AsmJsCompilationException::AsmJsCompilationException
                    (pAVar3,L"Invalid Node location[%d] ",(ulong)rhsEmit & 0xffffffff);
          __cxa_throw(pAVar3,&AsmJsCompilationException::typeinfo,0);
        }
        bVar2 = AsmJsFunc::IsValidLocation<float>(this->mFunction,(EmitExpressionInfo *)&lType);
        if (!bVar2) {
          pAVar3 = (AsmJsCompilationException *)__cxa_allocate_exception(0x200);
          AsmJsCompilationException::AsmJsCompilationException
                    (pAVar3,L"Invalid Node location[%d] ",(ulong)lType & 0xffffffff);
          __cxa_throw(pAVar3,&AsmJsCompilationException::typeinfo,0);
        }
        this_local._0_4_ = AsmJsFunc::AcquireTmpRegister<int>(this->mFunction);
        AsmJsFunc::ReleaseLocation<float>(this->mFunction,(EmitExpressionInfo *)&lType);
        AsmJsFunc::ReleaseLocation<float>(this->mFunction,&rhsEmit);
        local_66 = *(OpCodeAsmJs *)(BinaryComparatorOpCodes + (long)(int)op * 8 + 4);
      }
    }
  }
  AsmJsByteCodeWriter::AsmReg3
            (&this->mWriter,local_66,this_local._0_4_,rhsEmit.super_EmitInfoBase.location,
             (RegSlot)lType);
  EndStatement(this,pnode);
  EVar1.type.which_ = this_local._4_4_;
  EVar1.super_EmitInfoBase.location = this_local._0_4_;
  return EVar1;
}

Assistant:

EmitExpressionInfo AsmJSByteCodeGenerator::EmitBinaryComparator( ParseNode * pnode, EBinaryComparatorOpCodes op )
    {
        ParseNode* lhs = ParserWrapper::GetBinaryLeft( pnode );
        ParseNode* rhs = ParserWrapper::GetBinaryRight( pnode );
        const EmitExpressionInfo& lhsEmit = Emit( lhs );
        EmitExpressionInfo rhsEmit = Emit( rhs );
        const AsmJsType& lType = lhsEmit.type;
        const AsmJsType& rType = rhsEmit.type;
        StartStatement(pnode);
        EmitExpressionInfo emitInfo(AsmJsType::Int);
        OpCodeAsmJs compOp;

        if (lType.isUnsigned() && rType.isUnsigned())
        {
            CheckNodeLocation(lhsEmit, int);
            CheckNodeLocation(rhsEmit, int);
            emitInfo.location = GetAndReleaseBinaryLocations<int>(&lhsEmit, &rhsEmit);
            compOp = BinaryComparatorOpCodes[op][BCOT_UInt];
        }
        else if( lType.isSigned() && rType.isSigned() )
        {
            CheckNodeLocation( lhsEmit, int );
            CheckNodeLocation( rhsEmit, int );
            emitInfo.location = GetAndReleaseBinaryLocations<int>( &lhsEmit, &rhsEmit );
            compOp = BinaryComparatorOpCodes[op][BCOT_Int];
        }
        else if( lType.isDouble() && rType.isDouble() )
        {
            CheckNodeLocation( lhsEmit, double );
            CheckNodeLocation( rhsEmit, double );
            emitInfo.location = mFunction->AcquireTmpRegister<int>();
            mFunction->ReleaseLocation<double>( &rhsEmit );
            mFunction->ReleaseLocation<double>( &lhsEmit );
            compOp = BinaryComparatorOpCodes[op][BCOT_Double];
        }
        else if (lType.isFloat() && rType.isFloat())
        {
            CheckNodeLocation(lhsEmit, float);
            CheckNodeLocation(rhsEmit, float);
            emitInfo.location = mFunction->AcquireTmpRegister<int>();
            mFunction->ReleaseLocation<float>(&rhsEmit);
            mFunction->ReleaseLocation<float>(&lhsEmit);
            compOp = BinaryComparatorOpCodes[op][BCOT_Float];
        }
        else
        {
            throw AsmJsCompilationException( _u("Type not supported for comparison") );
        }
        mWriter.AsmReg3( compOp, emitInfo.location, lhsEmit.location, rhsEmit.location );
        EndStatement(pnode);
        return emitInfo;
    }